

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

bool cfd::core::Privkey::HasWif(string *wif,NetType *net_type,bool *is_compressed)

{
  char *wif_00;
  size_t sVar1;
  byte *pbVar2;
  char *local_98;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint local_7c;
  undefined1 local_78 [4];
  uint32_t prefix;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  undefined1 local_50 [8];
  ByteData data;
  bool has_wif;
  size_t sStack_30;
  int ret;
  size_t is_uncompressed;
  bool *is_compressed_local;
  NetType *net_type_local;
  string *wif_local;
  
  sStack_30 = 0;
  is_uncompressed = (size_t)is_compressed;
  is_compressed_local = (bool *)net_type;
  net_type_local = (NetType *)wif;
  wif_00 = (char *)::std::__cxx11::string::c_str();
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       wally_wif_is_uncompressed(wif_00,&stack0xffffffffffffffd0);
  if (data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    CryptoUtil::DecodeBase58Check((ByteData *)local_50,(string *)net_type_local);
    sVar1 = ByteData::GetDataSize((ByteData *)local_50);
    if (0x20 < sVar1) {
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
                         (ByteData *)local_50);
      pbVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,0);
      local_7c = (uint)*pbVar2;
      if (is_compressed_local != (bool *)0x0) {
        if (local_7c == 0x80) {
          is_compressed_local[0] = false;
          is_compressed_local[1] = false;
          is_compressed_local[2] = false;
          is_compressed_local[3] = false;
        }
        else if (local_7c == 0xef) {
          is_compressed_local[0] = true;
          is_compressed_local[1] = false;
          is_compressed_local[2] = false;
          is_compressed_local[3] = false;
        }
        else {
          local_98 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_key.cpp"
                             ,0x2f);
          local_98 = local_98 + 1;
          in_stack_ffffffffffffff70 = 0x174;
          logger::warn<unsigned_int&>
                    ((CfdSourceLocation *)&local_98,"Invalid Privkey format. prefix={}",&local_7c);
          is_compressed_local[0] = true;
          is_compressed_local[1] = false;
          is_compressed_local[2] = false;
          is_compressed_local[3] = false;
        }
      }
      if (is_uncompressed != 0) {
        *(byte *)is_uncompressed = -(sStack_30 == 0) & 1;
      }
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    wif_local._7_1_ =
         data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._3_1_ & 1;
    ByteData::~ByteData((ByteData *)0x45148b);
  }
  else {
    wif_local._7_1_ = 0;
  }
  return (bool)(wif_local._7_1_ & 1);
}

Assistant:

bool Privkey::HasWif(
    const std::string &wif, NetType *net_type, bool *is_compressed) {
  static constexpr size_t kWifMinimumSize = EC_PRIVATE_KEY_LEN + 1;

  size_t is_uncompressed = 0;
  int ret = wally_wif_is_uncompressed(wif.c_str(), &is_uncompressed);
  if (ret != WALLY_OK) {
    // contains check wif.
    return false;
  }

  bool has_wif = false;
  ByteData data = CryptoUtil::DecodeBase58Check(wif);
  if (data.GetDataSize() >= kWifMinimumSize) {
    std::vector<uint8_t> key_data = data.GetBytes();
    uint32_t prefix = key_data[0];

    if (net_type != nullptr) {
      if (prefix == kPrefixMainnet) {
        *net_type = NetType::kMainnet;
      } else if (prefix == kPrefixTestnet) {
        *net_type = NetType::kTestnet;
      } else {
        warn(CFD_LOG_SOURCE, "Invalid Privkey format. prefix={}", prefix);
        *net_type = NetType::kTestnet;
      }
    }

    if (is_compressed != nullptr) {
      *is_compressed = (is_uncompressed == 0) ? true : false;
    }
    has_wif = true;
  }
  return has_wif;
}